

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void add_reg_to_rw_list(MCInst *MI,m680x_reg reg,e_access access)

{
  byte bVar1;
  cs_detail *regs;
  uint16_t uVar2;
  _Bool _Var3;
  
  regs = MI->flat_insn->detail;
  if (reg != M680X_REG_INVALID && regs != (cs_detail *)0x0) {
    uVar2 = (uint16_t)reg;
    if (access == READ) {
      bVar1 = regs->regs_read_count;
      _Var3 = exists_reg_list(regs->regs_read,bVar1,reg);
      if (!_Var3) {
        regs->regs_read_count = bVar1 + 1;
        regs->regs_read[bVar1] = uVar2;
      }
    }
    else {
      if (access != WRITE) {
        if (access != MODIFY) {
          return;
        }
        bVar1 = regs->regs_read_count;
        _Var3 = exists_reg_list(regs->regs_read,bVar1,reg);
        if (!_Var3) {
          regs->regs_read_count = bVar1 + 1;
          regs->regs_read[bVar1] = uVar2;
        }
      }
      bVar1 = regs->regs_write_count;
      _Var3 = exists_reg_list(regs->regs_write,bVar1,reg);
      if (!_Var3) {
        regs->regs_write_count = bVar1 + 1;
        regs->regs_write[bVar1] = uVar2;
      }
    }
  }
  return;
}

Assistant:

static void add_reg_to_rw_list(m68k_info *info, m68k_reg reg, int write)
{
	if (reg == M68K_REG_INVALID)
		return;

	if (write)
	{
		if (exists_reg_list(info->regs_write, info->regs_write_count, reg))
			return;

		info->regs_write[info->regs_write_count] = (uint16_t)reg;
		info->regs_write_count++;
	}
	else
	{
		if (exists_reg_list(info->regs_read, info->regs_read_count, reg))
			return;

		info->regs_read[info->regs_read_count] = (uint16_t)reg;
		info->regs_read_count++;
	}
}